

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute.cpp
# Opt level: O0

int match(State *initial,P_Sequence *p,bool allpaths)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  reference ppPVar5;
  value_type *bk;
  State local_100;
  StateP local_a8;
  undefined1 local_40 [8];
  vector<StateP,_std::allocator<StateP>_> stk;
  int nmatch;
  bool allpaths_local;
  P_Sequence *p_local;
  State *initial_local;
  
  stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = allpaths;
  std::vector<StateP,_std::allocator<StateP>_>::vector
            ((vector<StateP,_std::allocator<StateP>_> *)local_40);
  State::State(&local_100,initial);
  StateP::StateP(&local_a8,&local_100,p,0);
  std::vector<StateP,_std::allocator<StateP>_>::push_back
            ((vector<StateP,_std::allocator<StateP>_> *)local_40,&local_a8);
  StateP::~StateP(&local_a8);
  State::~State(&local_100);
  do {
    while( true ) {
      bVar1 = std::vector<StateP,_std::allocator<StateP>_>::empty
                        ((vector<StateP,_std::allocator<StateP>_> *)local_40);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        initial_local._4_4_ =
             (int)stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        goto LAB_00125ee9;
      }
      pvVar3 = std::vector<StateP,_std::allocator<StateP>_>::back
                         ((vector<StateP,_std::allocator<StateP>_> *)local_40);
      iVar2 = pvVar3->iseq;
      sVar4 = std::vector<Pattern_*,_std::allocator<Pattern_*>_>::size(&pvVar3->seq->v);
      if ((long)iVar2 != sVar4) break;
      pvVar3->iseq = pvVar3->seq->iparent + 1;
      pvVar3->seq = pvVar3->seq->parent;
    }
    ppPVar5 = std::vector<Pattern_*,_std::allocator<Pattern_*>_>::at
                        (&pvVar3->seq->v,(long)pvVar3->iseq);
    iVar2 = Pattern_match(*ppPVar5,(vector<StateP,_std::allocator<StateP>_> *)local_40);
    if (iVar2 == 1) {
      if ((stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._7_1_ & 1) == 0) {
        initial_local._4_4_ = 1;
        goto LAB_00125ee9;
      }
      stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)stk.super__Vector_base<StateP,_std::allocator<StateP>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
      std::vector<StateP,_std::allocator<StateP>_>::pop_back
                ((vector<StateP,_std::allocator<StateP>_> *)local_40);
    }
    sVar4 = std::vector<StateP,_std::allocator<StateP>_>::size
                      ((vector<StateP,_std::allocator<StateP>_> *)local_40);
  } while (sVar4 < 100000);
  initial_local._4_4_ = -1;
LAB_00125ee9:
  std::vector<StateP,_std::allocator<StateP>_>::~vector
            ((vector<StateP,_std::allocator<StateP>_> *)local_40);
  return initial_local._4_4_;
}

Assistant:

int match(State initial, P_Sequence *p, bool allpaths) {
    int nmatch = 0;
    vector<StateP> stk;
    stk.push_back(StateP{ initial, p, 0 });
    while (!stk.empty()) {
        auto &bk = stk.back();
        if (bk.iseq == bk.seq->v.size()) {
            bk.iseq = bk.seq->iparent + 1;
            bk.seq = bk.seq->parent;
        } else {
            if (Pattern_match(bk.seq->v.at(bk.iseq), stk) == 1) {
                if (!allpaths) return 1;
                nmatch++;
                stk.pop_back();
            }
            if (stk.size() > MAX_PATTERN_STACK) {
                return MATCH_RESULT_OVERFLOW;
            }
        }
    }
    return nmatch;
}